

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream * QtPrivate::readArrayBasedContainer<QList<QPointF>>(QDataStream *s,QList<QPointF> *c)

{
  QDataStream QVar1;
  char cVar2;
  undefined1 *asize;
  long in_FS_OFFSET;
  quint32 first;
  QPointF local_48;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar2 = QDataStream::isDeviceTransactionStarted();
  if (cVar2 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QPointF>::clear(c);
  local_34 = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_34);
  asize = (undefined1 *)(ulong)local_34;
  if (asize == (undefined1 *)0xfffffffe) {
    if (0x15 < *(int *)(s + 0x18)) {
      local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(longlong *)&local_48);
      asize = (undefined1 *)local_48.xp;
      if ((long)local_48.xp < 0) goto LAB_00424b14;
    }
  }
  else if (local_34 == 0xffffffff) {
LAB_00424b14:
    QDataStream::setStatus((Status)s);
    goto LAB_00424b9d;
  }
  QList<QPointF>::reserve(c,(qsizetype)asize);
  for (; asize != (undefined1 *)0x0; asize = asize + -1) {
    local_48.xp = 0.0;
    local_48.yp = 0.0;
    ::operator>>(s,&local_48);
    if (s[0x13] != (QDataStream)0x0) {
      QList<QPointF>::clear(c);
      break;
    }
    QPodArrayOps<QPointF>::emplace<QPointF_const&>((QPodArrayOps<QPointF> *)c,(c->d).size,&local_48)
    ;
    QList<QPointF>::end(c);
  }
LAB_00424b9d:
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}